

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O2

void __thiscall t_html_generator::generate_program_toc_row(t_html_generator *this,t_program *tprog)

{
  ofstream_with_content_based_conditional_update *poVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  string *psVar4;
  _Base_ptr p_Var5;
  t_program *ptVar6;
  _Alloc_hider _Var7;
  pointer pptVar8;
  vector<t_enum_*,_std::allocator<t_enum_*>_> enums;
  string html;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  data_types;
  string name;
  string fn_name;
  string fname;
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  t_program *local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  pointer local_218;
  undefined1 local_210 [32];
  _Rb_tree_node_base *local_1f0;
  size_t local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_140;
  _Vector_base<t_service_*,_std::allocator<t_service_*>_> local_128;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::operator+(&local_1c0,&tprog->name_,".html");
  poVar1 = &this->f_out_;
  poVar2 = std::operator<<((ostream *)poVar1,"<tr>");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"<td>");
  poVar2 = std::operator<<(poVar2,(string *)&tprog->name_);
  std::operator<<(poVar2,"</td><td>");
  local_2f0 = tprog;
  if ((tprog->services_).super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (tprog->services_).super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
              ((vector<t_service_*,_std::allocator<t_service_*>_> *)&local_128,&tprog->services_);
    while (local_128._M_impl.super__Vector_impl_data._M_start !=
           local_128._M_impl.super__Vector_impl_data._M_finish) {
      local_218 = local_128._M_impl.super__Vector_impl_data._M_start;
      (*(this->super_t_generator)._vptr_t_generator[0x1a])
                (local_210,this,*local_128._M_impl.super__Vector_impl_data._M_start);
      poVar2 = std::operator<<((ostream *)poVar1,"<a href=\"");
      std::__cxx11::string::string((string *)&local_b0,(string *)&local_1c0);
      make_file_link(&local_1a0.first,this,&local_b0);
      poVar2 = std::operator<<(poVar2,(string *)&local_1a0);
      poVar2 = std::operator<<(poVar2,"#Svc_");
      poVar2 = std::operator<<(poVar2,(string *)local_210);
      poVar2 = std::operator<<(poVar2,"\">");
      poVar2 = std::operator<<(poVar2,(string *)local_210);
      poVar2 = std::operator<<(poVar2,"</a><br/>");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_b0);
      poVar2 = std::operator<<((ostream *)poVar1,"<ul>");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      local_248._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_248._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_248._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_248._M_impl.super__Rb_tree_header._M_header;
      local_248._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_248._M_impl.super__Rb_tree_header._M_header._M_right =
           local_248._M_impl.super__Rb_tree_header._M_header._M_left;
      std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
                ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_140,
                 &(*local_218)->functions_);
      for (pptVar8 = local_140._M_impl.super__Vector_impl_data._M_start;
          p_Var3 = local_248._M_impl.super__Rb_tree_header._M_header._M_left,
          pptVar8 != local_140._M_impl.super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
        std::__cxx11::string::string((string *)&local_1e0,(string *)&(*pptVar8)->name_);
        std::__cxx11::string::string((string *)&local_50,(string *)&local_1c0);
        make_file_link(&local_d0,this,&local_50);
        std::operator+(&local_160,"<li><a href=\"",&local_d0);
        std::operator+(&local_310,&local_160,"#Fn_");
        std::operator+(&local_2e8,&local_310,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_210);
        std::operator+(&local_2c8,&local_2e8,"_");
        std::operator+(&local_2a8,&local_2c8,&local_1e0);
        std::operator+(&local_288,&local_2a8,"\">");
        std::operator+(&local_1a0.first,&local_288,&local_1e0);
        std::operator+(&local_268,&local_1a0.first,"</a></li>");
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_50);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_1a0,&local_1e0,&local_268);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&local_248,&local_1a0);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_1a0);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_1e0);
      }
      for (; (_Rb_tree_header *)p_Var3 != &local_248._M_impl.super__Rb_tree_header;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        poVar2 = std::operator<<((ostream *)poVar1,(string *)(p_Var3 + 2));
        std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      }
      poVar2 = std::operator<<((ostream *)poVar1,"</ul>");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_140);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_248);
      std::__cxx11::string::~string((string *)local_210);
      local_128._M_impl.super__Vector_impl_data._M_start = local_218 + 1;
    }
    std::_Vector_base<t_service_*,_std::allocator<t_service_*>_>::~_Vector_base(&local_128);
  }
  ptVar6 = local_2f0;
  poVar2 = std::operator<<((ostream *)poVar1,"</td>");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,"<td>");
  local_248._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_248._M_impl.super__Rb_tree_header._M_header;
  local_248._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_248._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_248._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_248._M_impl.super__Rb_tree_header._M_header._M_right =
       local_248._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((ptVar6->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar6->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector
              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&local_310,&ptVar6->enums_);
    for (_Var7._M_p = local_310._M_dataplus._M_p; _Var7._M_p != (pointer)local_310._M_string_length;
        _Var7._M_p = _Var7._M_p + 8) {
      psVar4 = (string *)(**(code **)(**(long **)_Var7._M_p + 0x18))();
      std::__cxx11::string::string((string *)local_210,psVar4);
      std::__cxx11::string::string((string *)&local_f0,(string *)&local_1c0);
      make_file_link(&local_2e8,this,&local_f0);
      std::operator+(&local_2c8,"<a href=\"",&local_2e8);
      std::operator+(&local_2a8,&local_2c8,"#Enum_");
      std::operator+(&local_288,&local_2a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210)
      ;
      std::operator+(&local_268,&local_288,"\">");
      std::operator+(&local_1a0.first,&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210)
      ;
      std::operator+(&local_1e0,&local_1a0.first,"</a>");
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_f0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                 &local_1e0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&local_248,&local_1a0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_1a0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)local_210);
    }
    std::_Vector_base<t_enum_*,_std::allocator<t_enum_*>_>::~_Vector_base
              ((_Vector_base<t_enum_*,_std::allocator<t_enum_*>_> *)&local_310);
    ptVar6 = local_2f0;
  }
  if ((ptVar6->typedefs_).super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar6->typedefs_).super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&local_310,&ptVar6->typedefs_);
    for (_Var7._M_p = local_310._M_dataplus._M_p; _Var7._M_p != (pointer)local_310._M_string_length;
        _Var7._M_p = _Var7._M_p + 8) {
      std::__cxx11::string::string((string *)local_210,(string *)(*(long *)_Var7._M_p + 0x90));
      std::__cxx11::string::string((string *)&local_70,(string *)&local_1c0);
      make_file_link(&local_2e8,this,&local_70);
      std::operator+(&local_2c8,"<a href=\"",&local_2e8);
      std::operator+(&local_2a8,&local_2c8,"#Typedef_");
      std::operator+(&local_288,&local_2a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210)
      ;
      std::operator+(&local_268,&local_288,"\">");
      std::operator+(&local_1a0.first,&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210)
      ;
      std::operator+(&local_1e0,&local_1a0.first,"</a>");
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_70);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                 &local_1e0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&local_248,&local_1a0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_1a0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)local_210);
    }
    std::_Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>::~_Vector_base
              ((_Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_> *)&local_310);
    ptVar6 = local_2f0;
  }
  if ((ptVar6->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar6->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector
              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&local_310,&ptVar6->objects_);
    for (; local_310._M_dataplus._M_p != (pointer)local_310._M_string_length;
        local_310._M_dataplus._M_p = local_310._M_dataplus._M_p + 8) {
      psVar4 = (string *)(**(code **)(**(long **)local_310._M_dataplus._M_p + 0x18))();
      std::__cxx11::string::string((string *)local_210,psVar4);
      std::__cxx11::string::string((string *)&local_110,(string *)&local_1c0);
      make_file_link(&local_2e8,this,&local_110);
      std::operator+(&local_2c8,"<a href=\"",&local_2e8);
      std::operator+(&local_2a8,&local_2c8,"#Struct_");
      std::operator+(&local_288,&local_2a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210)
      ;
      std::operator+(&local_268,&local_288,"\">");
      std::operator+(&local_1a0.first,&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210)
      ;
      std::operator+(&local_1e0,&local_1a0.first,"</a>");
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_110);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                 &local_1e0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&local_248,&local_1a0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_1a0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)local_210);
    }
    std::_Vector_base<t_struct_*,_std::allocator<t_struct_*>_>::~_Vector_base
              ((_Vector_base<t_struct_*,_std::allocator<t_struct_*>_> *)&local_310);
    ptVar6 = local_2f0;
  }
  for (p_Var5 = local_248._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &local_248._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    poVar2 = std::operator<<((ostream *)poVar1,(string *)(p_Var5 + 2));
    poVar2 = std::operator<<(poVar2,"<br/>");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  poVar2 = std::operator<<((ostream *)poVar1,"</td>");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,"<td>");
  if ((ptVar6->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar6->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_210._24_8_ = local_210 + 8;
    local_210._8_4_ = _S_red;
    local_210._16_8_ = 0;
    local_1e8 = 0;
    local_1f0 = (_Rb_tree_node_base *)local_210._24_8_;
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)&local_160,&ptVar6->consts_);
    for (; local_160._M_dataplus._M_p != (pointer)local_160._M_string_length;
        local_160._M_dataplus._M_p = local_160._M_dataplus._M_p + 8) {
      std::__cxx11::string::string
                ((string *)&local_1e0,(string *)(*(long *)local_160._M_dataplus._M_p + 0x38));
      std::__cxx11::string::string((string *)&local_90,(string *)&local_1c0);
      make_file_link(&local_310,this,&local_90);
      std::operator+(&local_2e8,"<code><a href=\"",&local_310);
      std::operator+(&local_2c8,&local_2e8,"#Const_");
      std::operator+(&local_2a8,&local_2c8,&local_1e0);
      std::operator+(&local_288,&local_2a8,"\">");
      std::operator+(&local_1a0.first,&local_288,&local_1e0);
      std::operator+(&local_268,&local_1a0.first,"</a></code>");
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_90);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_1a0,&local_1e0,&local_268);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)local_210,&local_1a0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_1a0);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    for (p_Var3 = (_Rb_tree_node_base *)local_210._24_8_;
        p_Var3 != (_Rb_tree_node_base *)(local_210 + 8);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      poVar2 = std::operator<<((ostream *)poVar1,(string *)(p_Var3 + 2));
      poVar2 = std::operator<<(poVar2,"<br/>");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    }
    std::_Vector_base<t_const_*,_std::allocator<t_const_*>_>::~_Vector_base
              ((_Vector_base<t_const_*,_std::allocator<t_const_*>_> *)&local_160);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_210);
  }
  poVar2 = std::operator<<((ostream *)poVar1,"</td>");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,"</tr>");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_248);
  std::__cxx11::string::~string((string *)&local_1c0);
  return;
}

Assistant:

void t_html_generator::generate_program_toc_row(t_program* tprog) {
  string fname = tprog->get_name() + ".html";
  f_out_ << "<tr>" << endl << "<td>" << tprog->get_name() << "</td><td>";
  if (!tprog->get_services().empty()) {
    vector<t_service*> services = tprog->get_services();
    vector<t_service*>::iterator sv_iter;
    for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
      string name = get_service_name(*sv_iter);
      f_out_ << "<a href=\"" << make_file_link(fname) << "#Svc_" << name << "\">" << name
             << "</a><br/>" << endl;
      f_out_ << "<ul>" << endl;
      map<string, string> fn_html;
      vector<t_function*> functions = (*sv_iter)->get_functions();
      vector<t_function*>::iterator fn_iter;
      for (fn_iter = functions.begin(); fn_iter != functions.end(); ++fn_iter) {
        string fn_name = (*fn_iter)->get_name();
        string html = "<li><a href=\"" + make_file_link(fname) + "#Fn_" + name + "_" + fn_name
                      + "\">" + fn_name + "</a></li>";
        fn_html.insert(pair<string, string>(fn_name, html));
      }
      for (auto & html_iter : fn_html) {
        f_out_ << html_iter.second << endl;
      }
      f_out_ << "</ul>" << endl;
    }
  }
  f_out_ << "</td>" << endl << "<td>";
  map<string, string> data_types;
  if (!tprog->get_enums().empty()) {
    vector<t_enum*> enums = tprog->get_enums();
    vector<t_enum*>::iterator en_iter;
    for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
      string name = (*en_iter)->get_name();
      // f_out_ << "<a href=\"" << make_file_link(fname) << "#Enum_" << name << "\">" << name
      // <<  "</a><br/>" << endl;
      string html = "<a href=\"" + make_file_link(fname) + "#Enum_" + name + "\">" + name + "</a>";
      data_types.insert(pair<string, string>(name, html));
    }
  }
  if (!tprog->get_typedefs().empty()) {
    vector<t_typedef*> typedefs = tprog->get_typedefs();
    vector<t_typedef*>::iterator td_iter;
    for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
      string name = (*td_iter)->get_symbolic();
      // f_out_ << "<a href=\"" << make_file_link(fname) << "#Typedef_" << name << "\">" << name
      // << "</a><br/>" << endl;
      string html = "<a href=\"" + make_file_link(fname) + "#Typedef_" + name + "\">" + name
                    + "</a>";
      data_types.insert(pair<string, string>(name, html));
    }
  }
  if (!tprog->get_objects().empty()) {
    vector<t_struct*> objects = tprog->get_objects();
    vector<t_struct*>::iterator o_iter;
    for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
      string name = (*o_iter)->get_name();
      // f_out_ << "<a href=\"" << make_file_link(fname) << "#Struct_" << name << "\">" << name
      //<< "</a><br/>" << endl;
      string html = "<a href=\"" + make_file_link(fname) + "#Struct_" + name + "\">" + name
                    + "</a>";
      data_types.insert(pair<string, string>(name, html));
    }
  }
  for (auto & data_type : data_types) {
    f_out_ << data_type.second << "<br/>" << endl;
  }
  f_out_ << "</td>" << endl << "<td>";
  if (!tprog->get_consts().empty()) {
    map<string, string> const_html;
    vector<t_const*> consts = tprog->get_consts();
    vector<t_const*>::iterator con_iter;
    for (con_iter = consts.begin(); con_iter != consts.end(); ++con_iter) {
      string name = (*con_iter)->get_name();
      string html = "<code><a href=\"" + make_file_link(fname) + "#Const_" + name + "\">" + name
                    + "</a></code>";
      const_html.insert(pair<string, string>(name, html));
    }
    for (auto & con_iter : const_html) {
      f_out_ << con_iter.second << "<br/>" << endl;
    }
  }
  f_out_ << "</td>" << endl << "</tr>";
}